

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitPropDelete
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  Scope *symScope;
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  uint uVar4;
  ByteCodeLabel labelID;
  RegSlot value;
  Scope **ppSVar5;
  undefined4 *puVar6;
  Scope *scope;
  Type *pTVar7;
  int i;
  int index;
  undefined1 local_a8 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  PropertyId local_5c;
  DynamicLoadKind DStack_58;
  PropertyId envIndex;
  undefined1 local_4c [8];
  DynamicLoadRecord rec;
  
  local_5c = -1;
  ppSVar5 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar5 = &this->globalScope;
  }
  symScope = *ppSVar5;
  recList._40_8_ = pid;
  rec._4_8_ = funcInfo;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x14d1,"(symScope)","symScope");
    if (!bVar2) {
LAB_00818af5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       this->alloc;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  local_a8 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  this_00 = &this->m_writer;
  _DStack_58 = (undefined4 *)CONCAT44(envIndex,0xffffffff);
  scope = (Scope *)0x0;
  do {
    scope = FindScopeForSym(this,symScope,scope,&local_5c,(FuncInfo *)rec._4_8_);
    if (scope == this->globalScope) {
      _DStack_58 = (undefined4 *)CONCAT44(envIndex,0xfffffffd);
    }
    else if (local_5c == -1) {
      if (scope->func != (FuncInfo *)rec._4_8_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x14de,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar2) goto LAB_00818af5;
        *puVar6 = 0;
      }
      _DStack_58 = (undefined4 *)CONCAT44(envIndex,scope->location);
    }
    if (scope == symScope) {
      if (sym == (Symbol *)0x0) {
LAB_00818811:
        PVar3 = *(PropertyId *)(recList._40_8_ + 0x1c);
LAB_00818818:
        if ((this->flags & 0x404) == 0) {
          uVar4 = FuncInfo::FindOrAddReferencedPropertyId((FuncInfo *)rec._4_8_,PVar3);
          Js::ByteCodeWriter::Property(this_00,DeleteRootFld,lhsLocation,0xfffffffd,uVar4,false);
        }
        else {
          uVar4 = FuncInfo::FindOrAddReferencedPropertyId((FuncInfo *)rec._4_8_,PVar3);
          Js::ByteCodeWriter::ScopedProperty
                    (this_00,ScopedDeleteFld,lhsLocation,uVar4,
                     this->forceStrictModeForClassComputedPropertyName);
        }
      }
      else {
        if ((sym->field_0x42 & 8) != 0) {
          if (sym == (Symbol *)0x0) goto LAB_00818811;
          PVar3 = Symbol::EnsurePosition(sym,this);
          goto LAB_00818818;
        }
        Symbol::EnsureScopeSlot(sym,this,(FuncInfo *)rec._4_8_);
        Js::ByteCodeWriter::Reg1(this_00,LdFalse,lhsLocation);
      }
      if ((int)recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer
          == 0) goto LAB_00818a9b;
      labelID = Js::ByteCodeWriter::DefineLabel(this_00);
      Js::ByteCodeWriter::Br(this_00,labelID);
      index = 0;
      _DStack_58 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      break;
    }
    if ((scope == (Scope *)0x0) || ((scope->field_0x44 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x14e8,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar2) goto LAB_00818af5;
      *puVar6 = 0;
    }
    if ((scope->field_0x44 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x14e9,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar2) goto LAB_00818af5;
      *puVar6 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)local_4c);
    local_4c._4_4_ = Js::ByteCodeWriter::DefineLabel(this_00);
    if (sym == (Symbol *)0x0) {
      PVar3 = *(PropertyId *)(recList._40_8_ + 0x1c);
    }
    else {
      PVar3 = Symbol::EnsurePosition(sym,this);
    }
    uVar4 = FuncInfo::FindOrAddReferencedPropertyId((FuncInfo *)rec._4_8_,PVar3);
    PVar3 = local_5c;
    if (scope->scopeType == ScopeType_With) {
      if (local_5c == -1) {
        Js::ByteCodeWriter::BrProperty(this_00,BrOnHasProperty,local_4c._4_4_,DStack_58,uVar4);
        local_4c._0_4_ = LocalWith;
        goto LAB_0081878d;
      }
      Js::ByteCodeWriter::BrEnvProperty
                (this_00,BrOnHasEnvProperty,local_4c._4_4_,uVar4,local_5c + 1);
      local_4c._0_4_ = EnvWith;
LAB_00818744:
      rec.kind = PVar3 + Local;
    }
    else {
      if (local_5c != -1) {
        Js::ByteCodeWriter::BrEnvProperty
                  (this_00,BrOnHasLocalEnvProperty,local_4c._4_4_,uVar4,local_5c + 1);
        local_4c._0_4_ = Env;
        goto LAB_00818744;
      }
      Js::ByteCodeWriter::BrLocalProperty(this_00,BrOnHasLocalProperty,local_4c._4_4_,uVar4);
      local_4c._0_4_ = Local;
LAB_0081878d:
      rec.kind = DStack_58;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)local_a8,0);
    *(DynamicLoadKind *)
     ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
            _vptr_ReadOnlyList +
     (long)(int)recList.
                super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                buffer * 0xc + 8) = rec.kind;
    *(ulong *)((long)recList.
                     super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                     _vptr_ReadOnlyList +
              (long)(int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer * 0xc) = CONCAT44(local_4c._4_4_,local_4c._0_4_);
    recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
    _0_4_ = (int)recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer + 1;
  } while( true );
LAB_008188a5:
  if (sym == (Symbol *)0x0) {
    PVar3 = *(PropertyId *)(recList._40_8_ + 0x1c);
  }
  else {
    PVar3 = Symbol::EnsurePosition(sym,this);
  }
  uVar4 = FuncInfo::FindOrAddReferencedPropertyId((FuncInfo *)rec._4_8_,PVar3);
  pTVar7 = JsUtil::
           List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_a8,index);
  Js::ByteCodeWriter::MarkLabel(this_00,pTVar7->label);
  pTVar7 = JsUtil::
           List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_a8,index);
  switch(pTVar7->kind) {
  case Local:
    Js::ByteCodeWriter::ElementU(this_00,DeleteLocalFld_ReuseLoc,lhsLocation,uVar4);
    goto LAB_00818a72;
  case Env:
    value = FuncInfo::AcquireTmpRegister((FuncInfo *)rec._4_8_);
    pTVar7 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,value,(pTVar7->field_2).index);
    Js::ByteCodeWriter::Property(this_00,DeleteFld_ReuseLoc,lhsLocation,value,uVar4,false);
    break;
  case LocalWith:
    value = FuncInfo::AcquireTmpRegister((FuncInfo *)rec._4_8_);
    pTVar7 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,value,(pTVar7->field_2).instance);
    Js::ByteCodeWriter::Property(this_00,DeleteFld_ReuseLoc,lhsLocation,value,uVar4,false);
    break;
  case EnvWith:
    value = FuncInfo::AcquireTmpRegister((FuncInfo *)rec._4_8_);
    pTVar7 = JsUtil::
             List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_a8,index);
    Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,value,(pTVar7->field_2).index);
    Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,value,value);
    Js::ByteCodeWriter::Property(this_00,DeleteFld_ReuseLoc,lhsLocation,value,uVar4,false);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *_DStack_58 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1554,"((0))","(0)");
    if (bVar2) {
      *_DStack_58 = 0;
      goto LAB_00818a72;
    }
    goto LAB_00818af5;
  }
  FuncInfo::ReleaseTmpRegister((FuncInfo *)rec._4_8_,value);
LAB_00818a72:
  if (index == (int)recList.
                    super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                    buffer + -1) {
    Js::ByteCodeWriter::MarkLabel(this_00,labelID);
LAB_00818a9b:
    local_a8 = (undefined1  [8])&PTR_IsReadOnly_014f2c30;
    if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
        _vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                 recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 _16_8_,recList.
                        super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                        ._vptr_ReadOnlyList,
                 (long)(int)recList.
                            super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                            .alloc * 0xc);
    }
    return;
  }
  Js::ByteCodeWriter::Br(this_00,labelID);
  index = index + 1;
  goto LAB_008188a5;
}

Assistant:

void ByteCodeGenerator::EmitPropDelete(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo)
{
    // If sym belongs to a parent frame, delete it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just return false.

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            scopeLocation = ByteCodeGenerator::RootObjectRegister;
        }
        else if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & (fscrEval | fscrImplicitThis))
        {
            this->m_writer.ScopedProperty(Js::OpCode::ScopedDeleteFld, lhsLocation,
                funcInfo->FindOrAddReferencedPropertyId(propertyId), forceStrictModeForClassComputedPropertyName);
        }
        else
        {
            this->m_writer.Property(Js::OpCode::DeleteRootFld, lhsLocation, ByteCodeGenerator::RootObjectRegister,
                funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }
    }
    else
    {
        // The delete will look like a non-local reference, so make sure a slot is reserved.
        sym->EnsureScopeSlot(this, funcInfo);
        this->m_writer.Reg1(Js::OpCode::LdFalse, lhsLocation);
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
            Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->m_writer.ElementU(Js::OpCode::DeleteLocalFld_ReuseLoc, lhsLocation, propertyIndex);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }
}